

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonSetFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  void *pvVar1;
  int iVar2;
  JsonNode *pJVar3;
  char *pcVar4;
  ulong uVar5;
  int bApnd;
  JsonParse x;
  int local_6c;
  JsonParse local_68;
  
  if (0 < argc) {
    pvVar1 = ctx->pFunc->pUserData;
    if ((argc & 1U) == 0) {
      pcVar4 = "insert";
      if (pvVar1 != (void *)0x0) {
        pcVar4 = "set";
      }
      jsonWrongNumArgs(ctx,pcVar4);
      return;
    }
    pcVar4 = (char *)sqlite3ValueText(*argv,'\x01');
    iVar2 = jsonParse(&local_68,ctx,pcVar4);
    if (iVar2 == 0) {
      if (argc != 1) {
        uVar5 = 1;
        do {
          pcVar4 = (char *)sqlite3ValueText(argv[uVar5],'\x01');
          local_6c = 0;
          pJVar3 = jsonLookup(&local_68,pcVar4,&local_6c,ctx);
          if (local_68.oom != '\0') {
            sqlite3_result_error_nomem(ctx);
            goto LAB_001bd9b5;
          }
          if (local_68.nErr != '\0') goto LAB_001bd9b5;
          if ((pJVar3 != (JsonNode *)0x0) && (local_6c != 0 || pvVar1 != (void *)0x0)) {
            pJVar3->jnFlags = pJVar3->jnFlags | 8;
            (pJVar3->u).iAppend = (int)uVar5 + 1;
          }
          uVar5 = uVar5 + 2;
        } while (uVar5 < (uint)argc);
      }
      if (((local_68.aNode)->jnFlags & 8) == 0) {
        jsonReturnJson(local_68.aNode,ctx,argv);
      }
      else {
        sqlite3_result_value(ctx,argv[((local_68.aNode)->u).iAppend]);
      }
LAB_001bd9b5:
      sqlite3_free(local_68.aNode);
      local_68.nNode = 0;
      local_68.nAlloc = 0;
      local_68.aNode = (JsonNode *)0x0;
      sqlite3_free(local_68.aUp);
    }
  }
  return;
}

Assistant:

static void jsonSetFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse x;          /* The parse */
  JsonNode *pNode;
  const char *zPath;
  u32 i;
  int bApnd;
  int bIsSet = sqlite3_user_data(ctx)!=0;

  if( argc<1 ) return;
  if( (argc&1)==0 ) {
    jsonWrongNumArgs(ctx, bIsSet ? "set" : "insert");
    return;
  }
  if( jsonParse(&x, ctx, (const char*)sqlite3_value_text(argv[0])) ) return;
  assert( x.nNode );
  for(i=1; i<(u32)argc; i+=2){
    zPath = (const char*)sqlite3_value_text(argv[i]);
    bApnd = 0;
    pNode = jsonLookup(&x, zPath, &bApnd, ctx);
    if( x.oom ){
      sqlite3_result_error_nomem(ctx);
      goto jsonSetDone;
    }else if( x.nErr ){
      goto jsonSetDone;
    }else if( pNode && (bApnd || bIsSet) ){
      testcase( pNode->eU!=0 && pNode->eU!=1 );
      assert( pNode->eU!=3 && pNode->eU!=5 );
      VVA( pNode->eU = 4 );
      pNode->jnFlags |= (u8)JNODE_REPLACE;
      pNode->u.iReplace = i + 1;
    }
  }
  if( x.aNode[0].jnFlags & JNODE_REPLACE ){
    assert( x.aNode[0].eU==4 );
    sqlite3_result_value(ctx, argv[x.aNode[0].u.iReplace]);
  }else{
    jsonReturnJson(x.aNode, ctx, argv);
  }
jsonSetDone:
  jsonParseReset(&x);
}